

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O1

int __thiscall
CDesign::GetNetInBBox(CDesign *this,vector<CNet_*,_std::allocator<CNet_*>_> *pNetList,CBBox *pBBox)

{
  pointer *pppCVar1;
  iterator __position;
  int iVar2;
  int iVar3;
  long lVar4;
  CNet *pNet;
  CNet *local_38;
  
  if ((pNetList != (vector<CNet_*,_std::allocator<CNet_*>_> *)0x0) &&
     ((pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    __assert_fail("pNetList==NULL||pNetList->size()==0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                  ,0x5a8,"int CDesign::GetNetInBBox(vector<CNet *> *, CBBox *)");
  }
  if (this->m_iNumNet < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      local_38 = this->m_ppNet[lVar4];
      if ((local_38 != (CNet *)0x0) && (iVar2 = CNet::IsRouted(local_38), iVar2 == 0)) {
        CNet::UpdateBBox(local_38);
        iVar2 = CBBox::IsInside(pBBox,&local_38->m_BBox);
        if ((iVar2 != 0) &&
           (iVar3 = iVar3 + 1, pNetList != (vector<CNet_*,_std::allocator<CNet_*>_> *)0x0)) {
          __position._M_current =
               (pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<CNet*,std::allocator<CNet*>>::_M_realloc_insert<CNet*const&>
                      ((vector<CNet*,std::allocator<CNet*>> *)pNetList,__position,&local_38);
          }
          else {
            *__position._M_current = local_38;
            pppCVar1 = &(pNetList->super__Vector_base<CNet_*,_std::allocator<CNet_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppCVar1 = *pppCVar1 + 1;
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->m_iNumNet);
  }
  return iVar3;
}

Assistant:

int CDesign::GetNetInBBox(vector<CNet*>* pNetList, CBBox* pBBox/*, int iMode, int iValue*/)
{
	//collect the all nets within the give box, satisfying the given condition (property/state)
	assert(pNetList==NULL||pNetList->size()==0);
	
	int	iNumNet	=	0;
	for (int i=0;i<m_iNumNet;++i)
	{
		CNet*	pNet	=	GetNet(i);
		
		if(!pNet)	continue;
		assert(pNet);

		//int		iContinue	=	TRUE;

		//switch(iMode){
		//case GET_MODE_STATE:
		//	if(pNet->GetState()&iValue)	iContinue	=	FALSE;
		//	break;
		//case GET_MODE_PROP:
		//	if(pNet->GetProp()&iValue)	iContinue	=	FALSE;
		//    break;
		//default:
		//    break;
		//}
		
		if(pNet->IsRouted())	continue;

		pNet->UpdateBBox();
		if(pBBox->IsInside(&pNet->m_BBox))
		{
			++iNumNet;
			if(pNetList)	pNetList->push_back(pNet);
		}		
	}
	
	return	iNumNet;
}